

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O0

JSONNode __thiscall JSONNode::pop_back(JSONNode *this,json_index_t pos)

{
  json_index_t jVar1;
  out_of_range *this_00;
  string *psVar2;
  JSONNode *pJVar3;
  uint in_EDX;
  undefined4 in_register_00000034;
  auto_delete local_38;
  auto_delete temp;
  json_index_t pos_local;
  JSONNode *this_local;
  
  pJVar3 = (JSONNode *)CONCAT44(in_register_00000034,pos);
  jVar1 = internalJSONNode::size(pJVar3->internal);
  if (jVar1 <= in_EDX) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    psVar2 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
    std::out_of_range::out_of_range(this_00,(string *)psVar2);
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  makeUniqueInternal(pJVar3);
  pJVar3 = internalJSONNode::pop_back(pJVar3->internal,in_EDX);
  auto_delete::auto_delete(&local_38,pJVar3);
  JSONNode(this,local_38.mynode);
  auto_delete::~auto_delete(&local_38);
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

json_throws(std::out_of_range) {
    JSON_CHECK_INTERNAL();
    if (json_unlikely(pos >= internal -> size())){
	   JSON_FAIL(JSON_TEXT("pop_back out of bounds"));
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }
    makeUniqueInternal();
    #ifdef JSON_LIBRARY
	   return internal -> pop_back(pos);
    #else
	   auto_delete temp(internal -> pop_back(pos));
	   return *temp.mynode;
    #endif
}